

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_threadprivate.cpp
# Opt level: O0

private_common * kmp_threadprivate_insert(int gtid,void *pc_addr,void *data_addr,size_t pc_size)

{
  bool bVar1;
  private_data *ppVar2;
  void *pvVar3;
  size_t in_RCX;
  void *in_RSI;
  int in_EDI;
  shared_common **lnk_tn;
  shared_common *d_tn;
  private_common **tt;
  private_common *tn;
  undefined8 in_stack_ffffffffffffff58;
  kmp_int32 gtid_00;
  kmp_lock_t *in_stack_ffffffffffffff60;
  private_data *in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  undefined1 local_60 [24];
  shared_common **local_48;
  shared_common *local_40;
  private_common **local_38;
  private_common *local_30;
  size_t local_28;
  void *local_18;
  int local_c;
  
  gtid_00 = (kmp_int32)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_c = in_EDI;
  __kmp_acquire_lock(in_stack_ffffffffffffff60,gtid_00);
  local_30 = (private_common *)___kmp_allocate((size_t)in_stack_ffffffffffffff60);
  local_30->gbl_addr = local_18;
  local_40 = __kmp_find_shared_task_common(&__kmp_threadprivate_d_table,local_c,local_18);
  if (local_40 == (shared_common *)0x0) {
    local_40 = (shared_common *)___kmp_allocate((size_t)in_stack_ffffffffffffff60);
    local_40->gbl_addr = local_18;
    local_40->cmn_size = local_28;
    ppVar2 = __kmp_init_common_data(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    local_40->pod_init = ppVar2;
    local_48 = __kmp_threadprivate_d_table.data + ((ulong)local_18 >> 3 & 0x1ff);
    local_40->next = *local_48;
    *local_48 = local_40;
  }
  else if ((local_40->pod_init == (private_data *)0x0) && (local_40->obj_init == (void *)0x0)) {
    local_40->cmn_size = local_28;
    if (local_40->is_vec == 0) {
      if ((local_40->ct).ctor == (kmpc_ctor)0x0) {
        if ((local_40->cct).cctor == (kmpc_cctor)0x0) {
          ppVar2 = __kmp_init_common_data
                             (in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
          local_40->pod_init = ppVar2;
        }
        else {
          pvVar3 = ___kmp_allocate((size_t)in_stack_ffffffffffffff60);
          local_40->obj_init = pvVar3;
          (*(local_40->cct).cctor)(local_40->obj_init,local_18);
        }
      }
      else {
        local_40->obj_init = (void *)0x0;
      }
    }
    else if ((local_40->ct).ctor == (kmpc_ctor)0x0) {
      if ((local_40->cct).cctor == (kmpc_cctor)0x0) {
        ppVar2 = __kmp_init_common_data(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68)
        ;
        local_40->pod_init = ppVar2;
      }
      else {
        pvVar3 = ___kmp_allocate((size_t)in_stack_ffffffffffffff60);
        local_40->obj_init = pvVar3;
        (*(local_40->cct).cctor)(local_40->obj_init,local_18);
      }
    }
    else {
      local_40->obj_init = (void *)0x0;
    }
  }
  local_30->cmn_size = local_40->cmn_size;
  if (__kmp_foreign_tp == 0) {
    bVar1 = KMP_UBER_GTID(local_c);
    if (!bVar1) goto LAB_0016d366;
  }
  else if (local_c != 0) {
LAB_0016d366:
    pvVar3 = ___kmp_allocate((size_t)in_stack_ffffffffffffff60);
    local_30->par_addr = pvVar3;
    goto LAB_0016d380;
  }
  local_30->par_addr = local_18;
LAB_0016d380:
  __kmp_release_lock(in_stack_ffffffffffffff60,gtid_00);
  if (local_40->cmn_size < local_28) {
    __kmp_msg_format((uint)local_60,0x40085);
    __kmp_fatal();
  }
  local_38 = ((__kmp_threads[local_c]->th).th_pri_common)->data + ((ulong)local_18 >> 3 & 0x1ff);
  local_30->next = *local_38;
  *local_38 = local_30;
  local_30->link = (__kmp_threads[local_c]->th).th_pri_head;
  (__kmp_threads[local_c]->th).th_pri_head = local_30;
  if (__kmp_foreign_tp == 0) {
    bVar1 = KMP_UBER_GTID(local_c);
    if (bVar1) {
      return local_30;
    }
  }
  else if (local_c == 0) {
    return local_30;
  }
  if (local_40->is_vec == 0) {
    if ((local_40->ct).ctor == (kmpc_ctor)0x0) {
      if ((local_40->cct).cctor == (kmpc_cctor)0x0) {
        if (local_30->par_addr != local_30->gbl_addr) {
          __kmp_copy_common_data(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        }
      }
      else {
        (*(local_40->cct).cctor)(local_30->par_addr,local_40->obj_init);
      }
    }
    else {
      (*(local_40->ct).ctor)(local_30->par_addr);
    }
  }
  else if ((local_40->ct).ctor == (kmpc_ctor)0x0) {
    if ((local_40->cct).cctor == (kmpc_cctor)0x0) {
      if (local_30->par_addr != local_30->gbl_addr) {
        __kmp_copy_common_data(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
    }
    else {
      (*(local_40->cct).cctor)(local_30->par_addr,local_40->obj_init);
    }
  }
  else {
    (*(local_40->ct).ctor)(local_30->par_addr);
  }
  return local_30;
}

Assistant:

struct private_common *kmp_threadprivate_insert(int gtid, void *pc_addr,
                                                void *data_addr,
                                                size_t pc_size) {
  struct private_common *tn, **tt;
  struct shared_common *d_tn;

  /* +++++++++ START OF CRITICAL SECTION +++++++++ */
  __kmp_acquire_lock(&__kmp_global_lock, gtid);

  tn = (struct private_common *)__kmp_allocate(sizeof(struct private_common));

  tn->gbl_addr = pc_addr;

  d_tn = __kmp_find_shared_task_common(
      &__kmp_threadprivate_d_table, gtid,
      pc_addr); /* Only the MASTER data table exists. */

  if (d_tn != 0) {
    /* This threadprivate variable has already been seen. */

    if (d_tn->pod_init == 0 && d_tn->obj_init == 0) {
      d_tn->cmn_size = pc_size;

      if (d_tn->is_vec) {
        if (d_tn->ct.ctorv != 0) {
          /* Construct from scratch so no prototype exists */
          d_tn->obj_init = 0;
        } else if (d_tn->cct.cctorv != 0) {
          /* Now data initialize the prototype since it was previously
           * registered */
          d_tn->obj_init = (void *)__kmp_allocate(d_tn->cmn_size);
          (void)(*d_tn->cct.cctorv)(d_tn->obj_init, pc_addr, d_tn->vec_len);
        } else {
          d_tn->pod_init = __kmp_init_common_data(data_addr, d_tn->cmn_size);
        }
      } else {
        if (d_tn->ct.ctor != 0) {
          /* Construct from scratch so no prototype exists */
          d_tn->obj_init = 0;
        } else if (d_tn->cct.cctor != 0) {
          /* Now data initialize the prototype since it was previously
             registered */
          d_tn->obj_init = (void *)__kmp_allocate(d_tn->cmn_size);
          (void)(*d_tn->cct.cctor)(d_tn->obj_init, pc_addr);
        } else {
          d_tn->pod_init = __kmp_init_common_data(data_addr, d_tn->cmn_size);
        }
      }
    }
  } else {
    struct shared_common **lnk_tn;

    d_tn = (struct shared_common *)__kmp_allocate(sizeof(struct shared_common));
    d_tn->gbl_addr = pc_addr;
    d_tn->cmn_size = pc_size;
    d_tn->pod_init = __kmp_init_common_data(data_addr, pc_size);
    /*
            d_tn->obj_init = 0;  // AC: commented out because __kmp_allocate
       zeroes the memory
            d_tn->ct.ctor = 0;
            d_tn->cct.cctor = 0;
            d_tn->dt.dtor = 0;
            d_tn->is_vec = FALSE;
            d_tn->vec_len = 0L;
    */
    lnk_tn = &(__kmp_threadprivate_d_table.data[KMP_HASH(pc_addr)]);

    d_tn->next = *lnk_tn;
    *lnk_tn = d_tn;
  }

  tn->cmn_size = d_tn->cmn_size;

  if ((__kmp_foreign_tp) ? (KMP_INITIAL_GTID(gtid)) : (KMP_UBER_GTID(gtid))) {
    tn->par_addr = (void *)pc_addr;
  } else {
    tn->par_addr = (void *)__kmp_allocate(tn->cmn_size);
  }

  __kmp_release_lock(&__kmp_global_lock, gtid);
/* +++++++++ END OF CRITICAL SECTION +++++++++ */

#ifdef USE_CHECKS_COMMON
  if (pc_size > d_tn->cmn_size) {
    KC_TRACE(
        10, ("__kmp_threadprivate_insert: THREADPRIVATE: %p (%" KMP_UINTPTR_SPEC
             " ,%" KMP_UINTPTR_SPEC ")\n",
             pc_addr, pc_size, d_tn->cmn_size));
    KMP_FATAL(TPCommonBlocksInconsist);
  }
#endif /* USE_CHECKS_COMMON */

  tt = &(__kmp_threads[gtid]->th.th_pri_common->data[KMP_HASH(pc_addr)]);

#ifdef KMP_TASK_COMMON_DEBUG
  if (*tt != 0) {
    KC_TRACE(
        10,
        ("__kmp_threadprivate_insert: WARNING! thread#%d: collision on %p\n",
         gtid, pc_addr));
  }
#endif
  tn->next = *tt;
  *tt = tn;

#ifdef KMP_TASK_COMMON_DEBUG
  KC_TRACE(10,
           ("__kmp_threadprivate_insert: thread#%d, inserted node %p on list\n",
            gtid, pc_addr));
  dump_list();
#endif

  /* Link the node into a simple list */

  tn->link = __kmp_threads[gtid]->th.th_pri_head;
  __kmp_threads[gtid]->th.th_pri_head = tn;

  if ((__kmp_foreign_tp) ? (KMP_INITIAL_GTID(gtid)) : (KMP_UBER_GTID(gtid)))
    return tn;

  /* if C++ object with copy constructor, use it;
   * else if C++ object with constructor, use it for the non-master copies only;
   * else use pod_init and memcpy
   *
   * C++ constructors need to be called once for each non-master thread on
   * allocate
   * C++ copy constructors need to be called once for each thread on allocate */

  /* C++ object with constructors/destructors; don't call constructors for
     master thread though */
  if (d_tn->is_vec) {
    if (d_tn->ct.ctorv != 0) {
      (void)(*d_tn->ct.ctorv)(tn->par_addr, d_tn->vec_len);
    } else if (d_tn->cct.cctorv != 0) {
      (void)(*d_tn->cct.cctorv)(tn->par_addr, d_tn->obj_init, d_tn->vec_len);
    } else if (tn->par_addr != tn->gbl_addr) {
      __kmp_copy_common_data(tn->par_addr, d_tn->pod_init);
    }
  } else {
    if (d_tn->ct.ctor != 0) {
      (void)(*d_tn->ct.ctor)(tn->par_addr);
    } else if (d_tn->cct.cctor != 0) {
      (void)(*d_tn->cct.cctor)(tn->par_addr, d_tn->obj_init);
    } else if (tn->par_addr != tn->gbl_addr) {
      __kmp_copy_common_data(tn->par_addr, d_tn->pod_init);
    }
  }
  /* !BUILD_OPENMP_C
      if (tn->par_addr != tn->gbl_addr)
          __kmp_copy_common_data( tn->par_addr, d_tn->pod_init ); */

  return tn;
}